

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<std::pair<cs_impl::any,cs_impl::any>> *this)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  any::to_string_abi_cxx11_(&local_38,(any *)(this + 8));
  std::operator+(&local_58,&local_38," : ");
  any::to_string_abi_cxx11_(&sStack_78,(any *)(this + 0x10));
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}